

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c-leakcheck.h
# Opt level: O0

void check_for_fd_leaks(void)

{
  int iVar1;
  int local_18;
  int local_14;
  int fds_2 [2];
  int fds_1 [2];
  
  iVar1 = pipe2(fds_2,0x80000);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x2f,"pipe2(fds_1, O_CLOEXEC) == 0");
  }
  iVar1 = pipe2(&local_18,0x80000);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x32,"pipe2(fds_2, O_CLOEXEC) == 0");
  }
  if (fds_2[0] != fd_leak_test_a) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x34,"fds_1[0] == fd_leak_test_a");
  }
  if (fds_2[1] != fd_leak_test_b) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x35,"fds_1[1] == fd_leak_test_b");
  }
  if (local_18 != fd_leak_test_c) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x36,"fds_2[0] == fd_leak_test_c");
  }
  if (local_14 != fd_leak_test_d) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x37,"fds_2[1] == fd_leak_test_d");
  }
  iVar1 = close(fds_2[0]);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x39,"close(fds_1[0]) == 0");
  }
  iVar1 = close(fds_2[1]);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x3a,"close(fds_1[1]) == 0");
  }
  iVar1 = close(local_18);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x3b,"close(fds_2[0]) == 0");
  }
  iVar1 = close(local_14);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x3c,"close(fds_2[1]) == 0");
  }
  return;
}

Assistant:

static void
check_for_fd_leaks(void)
{
	/* Test that all fds of previous tests
	 * have been closed successfully. */

	int fds_1[2];
	ATF_REQUIRE(pipe2(fds_1, O_CLOEXEC) == 0);

	int fds_2[2];
	ATF_REQUIRE(pipe2(fds_2, O_CLOEXEC) == 0);

	ATF_REQUIRE(fds_1[0] == fd_leak_test_a);
	ATF_REQUIRE(fds_1[1] == fd_leak_test_b);
	ATF_REQUIRE(fds_2[0] == fd_leak_test_c);
	ATF_REQUIRE(fds_2[1] == fd_leak_test_d);

	ATF_REQUIRE(close(fds_1[0]) == 0);
	ATF_REQUIRE(close(fds_1[1]) == 0);
	ATF_REQUIRE(close(fds_2[0]) == 0);
	ATF_REQUIRE(close(fds_2[1]) == 0);
}